

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

aiNode * __thiscall Assimp::D3MF::XmlSerializer::ReadObject(XmlSerializer *this,aiScene *scene)

{
  pointer *pppaVar1;
  iterator __position;
  pointer puVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  aiNode *paVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiMesh *paVar8;
  uint *puVar9;
  unsigned_long uVar10;
  long lVar11;
  ulong uVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> meshIds;
  aiMesh *mesh;
  string name;
  string type;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  aiNode *local_98;
  aiMesh *local_90;
  undefined1 *local_88;
  char *local_80;
  undefined1 local_78 [16];
  vector<aiMesh*,std::allocator<aiMesh*>> *local_68;
  unsigned_long local_60;
  aiNode *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  char *pcVar7;
  
  paVar6 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar6);
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_88 = local_78;
  local_80 = (char *)0x0;
  local_78[0] = 0;
  local_50 = local_40;
  local_48 = (char *)0x0;
  local_40[0] = 0;
  local_98 = paVar6;
  local_58 = paVar6;
  iVar5 = (*this->xmlReader->_vptr_IIrrXMLReader[7])();
  pcVar3 = local_80;
  pcVar7 = (char *)CONCAT44(extraout_var,iVar5);
  if (pcVar7 != (char *)0x0) {
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_88,0,pcVar3,(ulong)pcVar7);
  }
  iVar5 = (*this->xmlReader->_vptr_IIrrXMLReader[7])();
  pcVar3 = local_48;
  pcVar7 = (char *)CONCAT44(extraout_var_00,iVar5);
  if (pcVar7 != (char *)0x0) {
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar3,(ulong)pcVar7);
  }
  pcVar3 = local_80;
  paVar6 = local_98;
  local_98->mParent = scene->mRootNode;
  if (local_80 < (char *)0x400) {
    (local_98->mName).length = (ai_uint32)local_80;
    memcpy((local_98->mName).data,local_88,(size_t)local_80);
    (paVar6->mName).data[(long)pcVar3] = '\0';
  }
  local_68 = (vector<aiMesh*,std::allocator<aiMesh*>> *)&this->mMeshes;
  uVar10 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  while( true ) {
    bVar4 = ReadToEndElement(this,(string *)&XmlTag::object_abi_cxx11_);
    paVar6 = local_98;
    puVar2 = local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (!bVar4) break;
    (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    iVar5 = std::__cxx11::string::compare(XmlTag::mesh_abi_cxx11_);
    if (iVar5 == 0) {
      paVar8 = ReadMesh(this);
      pcVar3 = local_80;
      local_90 = paVar8;
      if (local_80 < (char *)0x400) {
        (paVar8->mName).length = (ai_uint32)local_80;
        memcpy((paVar8->mName).data,local_88,(size_t)local_80);
        (paVar8->mName).data[(long)pcVar3] = '\0';
      }
      __position._M_current =
           (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                  (local_68,__position,&local_90);
      }
      else {
        *__position._M_current = local_90;
        pppaVar1 = &(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppaVar1 = *pppaVar1 + 1;
      }
      local_60 = uVar10;
      if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_b8,
                   (iterator)
                   local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_60);
      }
      else {
        *local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar10;
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar10 = uVar10 + 1;
    }
  }
  lVar11 = (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_98->mNumMeshes = (uint)lVar11;
  puVar9 = (uint *)operator_new__((ulong)((long)local_b8.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_b8.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 1 &
                                  0x3fffffffc);
  paVar6->mMeshes = puVar9;
  if (0 < lVar11) {
    uVar12 = lVar11 + 1;
    lVar11 = 0;
    do {
      *(undefined4 *)((long)puVar9 + lVar11) = *(undefined4 *)((long)puVar2 + lVar11 * 2);
      uVar12 = uVar12 - 1;
      lVar11 = lVar11 + 4;
    } while (1 < uVar12);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return paVar6;
}

Assistant:

aiNode* ReadObject(aiScene* scene) {
        std::unique_ptr<aiNode> node(new aiNode());

        std::vector<unsigned long> meshIds;

        const char *attrib( nullptr );
        std::string name, type;
        attrib = xmlReader->getAttributeValue( D3MF::XmlTag::id.c_str() );
        if ( nullptr != attrib ) {
            name = attrib;
        }
        attrib = xmlReader->getAttributeValue( D3MF::XmlTag::type.c_str() );
        if ( nullptr != attrib ) {
            type = attrib;
        }

        node->mParent = scene->mRootNode;
        node->mName.Set(name);

        size_t meshIdx = mMeshes.size();

        while(ReadToEndElement(D3MF::XmlTag::object)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::mesh) {
                auto mesh = ReadMesh();

                mesh->mName.Set(name);
                mMeshes.push_back(mesh);
                meshIds.push_back(static_cast<unsigned long>(meshIdx));
                ++meshIdx;
            }
        }

        node->mNumMeshes = static_cast<unsigned int>(meshIds.size());

        node->mMeshes = new unsigned int[node->mNumMeshes];

        std::copy(meshIds.begin(), meshIds.end(), node->mMeshes);

        return node.release();
    }